

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFieldInfo.cpp
# Opt level: O2

string * __thiscall
ser::DataFieldInfo::ToString_abi_cxx11_(string *__return_storage_ptr__,DataFieldInfo *this)

{
  ostream *poVar1;
  ostringstream strm;
  string local_1b0;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,(string *)this);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->iSize_);
  poVar1 = std::operator<<(poVar1,"x");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->jSize_);
  poVar1 = std::operator<<(poVar1,"x");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->kSize_);
  poVar1 = std::operator<<(poVar1,"x");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->lSize_);
  poVar1 = std::operator<<(poVar1,") ");
  MetainfoSet::ToString_abi_cxx11_(&local_1b0,&this->metainfo_);
  std::operator<<(poVar1,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string DataFieldInfo::ToString() const
{
    std::ostringstream strm;
    strm << name_ << " ("
         << iSize_ << "x" << jSize_ << "x" << kSize_ << "x" << lSize_
         << ") " << metainfo_.ToString();
    return strm.str();
}